

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O0

uint gl4cts::TextureViewUtilities::getAmountOfComponentsForInternalformat(GLenum internalformat)

{
  TestError *this;
  uint result;
  GLenum internalformat_local;
  
  if (internalformat == 0x8051) {
    return 3;
  }
  if (internalformat == 0x8054) {
    return 3;
  }
  if (internalformat - 0x8056 < 4) {
    return 4;
  }
  if (internalformat == 0x805b) {
    return 4;
  }
  if ((1 < internalformat - 0x81a5) && (1 < internalformat - 0x8229)) {
    if (internalformat - 0x822b < 2) {
      return 2;
    }
    if (1 < internalformat - 0x822d) {
      if (internalformat - 0x822f < 2) {
        return 2;
      }
      if (5 < internalformat - 0x8231) {
        if (internalformat - 0x8237 < 6) {
          return 2;
        }
        if (internalformat == 0x8814) {
          return 4;
        }
        if (internalformat == 0x8815) {
          return 3;
        }
        if (internalformat == 0x881a) {
          return 4;
        }
        if (internalformat == 0x881b) {
          return 3;
        }
        if (internalformat != 0x88f0) {
          if (internalformat == 0x8c3a) {
            return 3;
          }
          if (internalformat == 0x8c3d) {
            return 3;
          }
          if (internalformat == 0x8c41) {
            return 3;
          }
          if (internalformat == 0x8c43) {
            return 4;
          }
          if (internalformat != 0x8cad) {
            if (internalformat == 0x8d62) {
              return 3;
            }
            if (internalformat == 0x8d70) {
              return 4;
            }
            if (internalformat == 0x8d71) {
              return 3;
            }
            if (internalformat == 0x8d76) {
              return 4;
            }
            if (internalformat == 0x8d77) {
              return 3;
            }
            if (internalformat == 0x8d7c) {
              return 4;
            }
            if (internalformat == 0x8d7d) {
              return 3;
            }
            if (internalformat == 0x8d82) {
              return 4;
            }
            if (internalformat == 0x8d83) {
              return 3;
            }
            if (internalformat == 0x8d88) {
              return 4;
            }
            if (internalformat == 0x8d89) {
              return 3;
            }
            if (internalformat == 0x8d8e) {
              return 4;
            }
            if (internalformat == 0x8d8f) {
              return 3;
            }
            if (1 < internalformat - 0x8dbb) {
              if (internalformat - 0x8dbd < 2) {
                return 2;
              }
              if (internalformat - 0x8e8c < 2) {
                return 4;
              }
              if (internalformat - 0x8e8e < 2) {
                return 3;
              }
              if (internalformat == 0x8f94) {
                return 1;
              }
              if (internalformat == 0x8f95) {
                return 2;
              }
              if (internalformat == 0x8f96) {
                return 3;
              }
              if (internalformat == 0x8f97) {
                return 4;
              }
              if (internalformat != 0x8f98) {
                if (internalformat == 0x8f99) {
                  return 2;
                }
                if (internalformat == 0x8f9a) {
                  return 3;
                }
                if (internalformat == 0x8f9b) {
                  return 4;
                }
                if (internalformat != 0x906f) {
                  this = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (this,"Unrecognized internalformat",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cTextureViewTests.cpp"
                             ,0x126);
                  __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                }
                return 4;
              }
              return 1;
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

unsigned int TextureViewUtilities::getAmountOfComponentsForInternalformat(const glw::GLenum internalformat)
{
	unsigned int result = 0;

	switch (internalformat)
	{
	case GL_COMPRESSED_RGBA_BPTC_UNORM:
	case GL_COMPRESSED_SRGB_ALPHA_BPTC_UNORM:
	case GL_RGB10_A2:
	case GL_RGB10_A2UI:
	case GL_RGB5_A1:
	case GL_RGBA16F:
	case GL_RGBA16I:
	case GL_RGBA16UI:
	case GL_RGBA16:
	case GL_RGBA16_SNORM:
	case GL_RGBA32F:
	case GL_RGBA32I:
	case GL_RGBA32UI:
	case GL_RGBA4:
	case GL_RGBA8I:
	case GL_RGBA8UI:
	case GL_RGBA8:
	case GL_RGBA8_SNORM:
	case GL_SRGB8_ALPHA8:
	{
		result = 4;

		break;
	}

	case GL_COMPRESSED_RGB_BPTC_SIGNED_FLOAT:
	case GL_COMPRESSED_RGB_BPTC_UNSIGNED_FLOAT:
	case GL_R11F_G11F_B10F:
	case GL_RGB16_SNORM:
	case GL_RGB16F:
	case GL_RGB16I:
	case GL_RGB16UI:
	case GL_RGB16:
	case GL_RGB32F:
	case GL_RGB32I:
	case GL_RGB32UI:
	case GL_RGB565:
	case GL_RGB8:
	case GL_RGB8_SNORM:
	case GL_RGB8I:
	case GL_RGB8UI:
	case GL_RGB9_E5:
	case GL_SRGB8:
	{
		result = 3;

		break;
	}

	case GL_COMPRESSED_RG_RGTC2:
	case GL_COMPRESSED_SIGNED_RG_RGTC2:
	case GL_RG16:
	case GL_RG16F:
	case GL_RG16I:
	case GL_RG16UI:
	case GL_RG16_SNORM:
	case GL_RG32F:
	case GL_RG32I:
	case GL_RG32UI:
	case GL_RG8:
	case GL_RG8_SNORM:
	case GL_RG8I:
	case GL_RG8UI:
	{
		result = 2;

		break;
	}

	case GL_COMPRESSED_RED_RGTC1:
	case GL_COMPRESSED_SIGNED_RED_RGTC1:
	case GL_DEPTH_COMPONENT16:
	case GL_DEPTH_COMPONENT24:
	case GL_DEPTH32F_STENCIL8: /* only one piece of information can be retrieved at a time */
	case GL_DEPTH24_STENCIL8:  /* only one piece of information can be retrieved at a time */
	case GL_R16:
	case GL_R16_SNORM:
	case GL_R16F:
	case GL_R16I:
	case GL_R16UI:
	case GL_R32F:
	case GL_R32I:
	case GL_R32UI:
	case GL_R8_SNORM:
	case GL_R8:
	case GL_R8I:
	case GL_R8UI:
	{
		result = 1;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognized internalformat");
	}
	} /* switch (interalformat) */

	return result;
}